

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range.h
# Opt level: O3

void __thiscall
llvm::iterator_range<llvm::AppleAcceleratorTable::ValueIterator>::iterator_range
          (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *this,
          ValueIterator *begin_iterator,ValueIterator *end_iterator)

{
  uint uVar1;
  uint uVar2;
  
  (this->begin_iterator).AccelTable = begin_iterator->AccelTable;
  (this->begin_iterator).Current.super_Entry._vptr_Entry =
       (_func_int **)&PTR___cxa_pure_virtual_00d777d8;
  SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
            (&(this->begin_iterator).Current.super_Entry.Values,
             &(begin_iterator->Current).super_Entry.Values);
  (this->begin_iterator).Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_00d776b8;
  (this->begin_iterator).Current.HdrData = (begin_iterator->Current).HdrData;
  uVar1 = begin_iterator->Data;
  uVar2 = begin_iterator->NumData;
  (this->begin_iterator).DataOffset = begin_iterator->DataOffset;
  (this->begin_iterator).Data = uVar1;
  (this->begin_iterator).NumData = uVar2;
  (this->end_iterator).AccelTable = end_iterator->AccelTable;
  (this->end_iterator).Current.super_Entry._vptr_Entry =
       (_func_int **)&PTR___cxa_pure_virtual_00d777d8;
  SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
            (&(this->end_iterator).Current.super_Entry.Values,
             &(end_iterator->Current).super_Entry.Values);
  (this->end_iterator).Current.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_00d776b8;
  (this->end_iterator).Current.HdrData = (end_iterator->Current).HdrData;
  uVar1 = end_iterator->Data;
  uVar2 = end_iterator->NumData;
  (this->end_iterator).DataOffset = end_iterator->DataOffset;
  (this->end_iterator).Data = uVar1;
  (this->end_iterator).NumData = uVar2;
  return;
}

Assistant:

iterator_range(IteratorT begin_iterator, IteratorT end_iterator)
      : begin_iterator(std::move(begin_iterator)),
        end_iterator(std::move(end_iterator)) {}